

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::SectionInfo::hasUntestedSections(SectionInfo *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  
  bVar3 = true;
  if (this->m_status != Unknown) {
    p_Var2 = (this->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((bVar3 = (_Rb_tree_header *)p_Var2 !=
                    &(this->m_subSections)._M_t._M_impl.super__Rb_tree_header, bVar3 &&
           (bVar1 = hasUntestedSections(*(SectionInfo **)(p_Var2 + 2)), !bVar1))) {
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    }
  }
  return bVar3;
}

Assistant:

bool hasUntestedSections() const {
            if( m_status == Unknown )
                return true;

            std::map<std::string, SectionInfo*>::const_iterator it = m_subSections.begin();
            std::map<std::string, SectionInfo*>::const_iterator itEnd = m_subSections.end();
            for(; it != itEnd; ++it ) {
                if( it->second->hasUntestedSections() )
                    return true;
            }
            return false;
        }